

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

optional<pbrt::SquareMatrix<4>_> * pbrt::Inverse<4>(SquareMatrix<4> *m)

{
  float fVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  undefined8 uVar5;
  long in_RCX;
  long lVar6;
  long in_RDX;
  optional<pbrt::SquareMatrix<4>_> *in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar41 [16];
  undefined1 auVar40 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  float fVar45;
  undefined4 uVar46;
  undefined1 local_88 [64];
  optional<pbrt::SquareMatrix<4>_> *local_40 [8];
  
  fVar1 = m->m[1][0];
  FVar2 = m->m[3][0];
  FVar3 = m->m[0][0];
  FVar4 = m->m[2][0];
  auVar22._8_4_ = 0x80000000;
  auVar22._0_8_ = 0x8000000080000000;
  auVar22._12_4_ = 0x80000000;
  auVar7 = vgatherdps_avx512vl(*(undefined4 *)((long)m->m[0] + in_RCX));
  auVar39 = ZEXT1664(auVar7);
  auVar9 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)FVar2),0x10);
  auVar24 = vinsertps_avx(ZEXT416((uint)FVar3),ZEXT416((uint)FVar4),0x10);
  auVar44._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
  auVar44._8_4_ = -auVar9._8_4_;
  auVar44._12_4_ = -auVar9._12_4_;
  auVar27._0_4_ = auVar9._0_4_ * auVar7._0_4_;
  auVar27._4_4_ = auVar9._4_4_ * auVar7._4_4_;
  auVar27._8_4_ = auVar9._8_4_ * auVar7._8_4_;
  auVar27._12_4_ = auVar9._12_4_ * auVar7._12_4_;
  auVar12 = vshufpd_avx(auVar7,auVar7,1);
  auVar15 = vinsertps_avx512f(auVar7,ZEXT416((uint)FVar4),0x10);
  auVar8 = vpermt2ps_avx512vl(auVar15,_DAT_004fc0d0,ZEXT416((uint)FVar3));
  auVar24 = vfmsub213ps_fma(auVar24,auVar12,auVar27);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar7,auVar27);
  auVar42._0_4_ = auVar24._0_4_ + auVar9._0_4_;
  auVar42._4_4_ = auVar24._4_4_ + auVar9._4_4_;
  auVar42._8_4_ = auVar24._8_4_ + auVar9._8_4_;
  auVar42._12_4_ = auVar24._12_4_ + auVar9._12_4_;
  auVar24 = vmovshdup_avx(auVar42);
  auVar28 = vgatherdps_avx512vl(*(undefined4 *)((long)m->m[0] + in_RDX));
  auVar27 = auVar28._0_16_;
  auVar40 = ZEXT3264(auVar28);
  auVar9 = vinsertps_avx(auVar12,ZEXT416((uint)FVar2),0x10);
  auVar9 = vpermt2ps_avx512vl(auVar9,_DAT_004fc0d0,ZEXT416((uint)fVar1));
  auVar43 = vpermps_avx2(ZEXT1632(_DAT_004fc0e0),auVar28);
  auVar41 = auVar28._16_16_;
  auVar29 = vpermpd_avx2(auVar28,0xe6);
  auVar10 = vpermi2ps_avx512vl(_DAT_004fc0f0,auVar41,auVar27);
  auVar15 = vshufps_avx(auVar29._0_16_,auVar29._0_16_,0xed);
  auVar16._0_4_ = fVar1 * auVar15._0_4_;
  auVar16._4_4_ = auVar12._4_4_ * auVar15._4_4_;
  auVar16._8_4_ = auVar12._8_4_ * auVar15._8_4_;
  auVar16._12_4_ = auVar12._12_4_ * auVar15._12_4_;
  auVar9 = vmulps_avx512vl(auVar9,auVar43._0_16_);
  auVar8 = vfmsub213ps_avx512vl(auVar10,auVar8,auVar9);
  auVar10 = vshufps_avx512vl(auVar41,auVar7,0xb2);
  auVar11 = vxorps_avx512vl(auVar10,auVar22);
  auVar12 = vpermi2ps_avx512vl(_DAT_004fc100,auVar44,auVar11);
  auVar13 = vfmadd213ps_avx512vl(auVar12,auVar43._0_16_,auVar9);
  auVar12._4_12_ = auVar7._4_12_;
  auVar12._0_4_ = FVar3;
  auVar9 = vinsertps_avx512f(auVar27,auVar41,0x9c);
  auVar14 = vfmsub213ps_avx512vl(auVar9,auVar12,auVar16);
  auVar9 = vinsertps_avx(auVar44,auVar11,0x9c);
  auVar12 = vfmadd213ps_fma(auVar9,auVar15,auVar16);
  auVar9 = vshufps_avx(auVar41,auVar41,0x77);
  auVar15 = vaddps_avx512vl(auVar8,auVar13);
  auVar8 = vshufps_avx512vl(auVar27,auVar7,0x17);
  auVar13 = vshufps_avx512vl(auVar27,auVar27,0x22);
  auVar12 = vaddps_avx512vl(auVar14,auVar12);
  auVar14 = vmulps_avx512vl(auVar10,auVar9);
  auVar16 = vshufpd_avx512vl(auVar15,auVar15,1);
  auVar17 = vmulss_avx512f(auVar15,auVar16);
  auVar8 = vfmsub213ps_avx512vl(auVar13,auVar8,auVar14);
  auVar10 = vfnmadd213ps_avx512vl(auVar9,auVar10,auVar14);
  auVar13 = vshufps_avx512vl(auVar15,auVar15,0xff);
  auVar9 = vmovshdup_avx(auVar12);
  auVar14 = vxorps_avx512vl(auVar13,auVar22);
  auVar16 = vfmsub213ss_avx512f(auVar16,auVar15,auVar17);
  auVar8 = vaddps_avx512vl(auVar8,auVar10);
  auVar10 = vmovshdup_avx512vl(auVar8);
  auVar18 = vshufps_avx512vl(auVar8,auVar8,0xff);
  auVar19 = vshufpd_avx512vl(auVar8,auVar8,1);
  auVar20 = vmulss_avx512f(auVar42,auVar8);
  auVar21 = vmulss_avx512f(auVar10,auVar24);
  auVar22 = vxorps_avx512vl(auVar18,auVar22);
  auVar14 = vmulss_avx512f(auVar19,auVar14);
  auVar23 = vfmsub213ss_avx512f(auVar8,auVar42,auVar20);
  auVar24 = vfmsub213ss_avx512f(auVar24,auVar10,auVar21);
  auVar10 = vmovshdup_avx512vl(auVar15);
  auVar13 = vfnmsub213ss_avx512f(auVar19,auVar13,auVar14);
  auVar19 = vmulss_avx512f(auVar12,auVar9);
  auVar22 = vmulss_avx512f(auVar10,auVar22);
  auVar9 = vfmsub213ss_avx512f(auVar9,auVar12,auVar19);
  auVar10 = vfnmsub213ss_avx512f(auVar10,auVar18,auVar22);
  auVar18 = vaddss_avx512f(auVar21,auVar22);
  auVar25 = vsubss_avx512f(auVar18,auVar22);
  auVar26 = vsubss_avx512f(auVar18,auVar25);
  auVar21 = vsubss_avx512f(auVar21,auVar25);
  auVar22 = vsubss_avx512f(auVar22,auVar26);
  auVar21 = vaddss_avx512f(auVar21,auVar22);
  auVar10 = vaddss_avx512f(auVar10,auVar21);
  auVar21 = vaddss_avx512f(auVar18,auVar17);
  auVar22 = vsubss_avx512f(auVar21,auVar18);
  auVar25 = vsubss_avx512f(auVar21,auVar22);
  auVar17 = vsubss_avx512f(auVar17,auVar22);
  auVar18 = vsubss_avx512f(auVar18,auVar25);
  auVar17 = vaddss_avx512f(auVar17,auVar18);
  auVar24 = vaddss_avx512f(auVar17,ZEXT416((uint)(auVar24._0_4_ + auVar10._0_4_)));
  auVar10 = vaddss_avx512f(auVar19,auVar21);
  auVar17 = vsubss_avx512f(auVar10,auVar21);
  auVar24 = vaddss_avx512f(auVar16,auVar24);
  auVar16 = vsubss_avx512f(auVar10,auVar17);
  auVar17 = vsubss_avx512f(auVar19,auVar17);
  auVar16 = vsubss_avx512f(auVar21,auVar16);
  auVar16 = vaddss_avx512f(auVar17,auVar16);
  auVar17 = vaddss_avx512f(auVar14,auVar10);
  auVar18 = vsubss_avx512f(auVar17,auVar10);
  auVar19 = vsubss_avx512f(auVar17,auVar18);
  auVar14 = vsubss_avx512f(auVar14,auVar18);
  auVar10 = vsubss_avx512f(auVar10,auVar19);
  auVar18 = vaddss_avx512f(auVar20,auVar17);
  auVar10 = vaddss_avx512f(auVar14,auVar10);
  auVar14 = vsubss_avx512f(auVar18,auVar17);
  auVar19 = vsubss_avx512f(auVar18,auVar14);
  auVar14 = vsubss_avx512f(auVar20,auVar14);
  auVar17 = vsubss_avx512f(auVar17,auVar19);
  auVar9 = vaddss_avx512f(auVar13,ZEXT416((uint)(auVar10._0_4_ +
                                                auVar9._0_4_ + auVar16._0_4_ + auVar24._0_4_)));
  auVar24 = vaddss_avx512f(auVar14,auVar17);
  auVar9 = vaddss_avx512f(auVar23,ZEXT416((uint)(auVar24._0_4_ + auVar9._0_4_)));
  auVar9 = vaddss_avx512f(auVar18,auVar9);
  fVar45 = auVar9._0_4_;
  if ((fVar45 == 0.0) && (!NAN(fVar45))) {
    *(undefined4 *)&in_RDI->set = 0;
    in_RDI->optionalValue =
         (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
         (ZEXT464(0) << 0x20);
    return in_RDI;
  }
  auVar30 = vbroadcastss_avx512f(ZEXT416(0x80000000));
  auVar31 = vbroadcastss_avx512f(ZEXT416((uint)FVar4));
  auVar32 = vbroadcastss_avx512f(ZEXT416((uint)FVar3));
  auVar9 = vmovshdup_avx(auVar41);
  auVar24 = vshufps_avx(auVar7,auVar7,0xd4);
  auVar33 = vpermi2ps_avx512f(_DAT_004fc340,ZEXT1664(auVar8),ZEXT1664(auVar12));
  auVar10._0_4_ = auVar9._0_4_ ^ auVar30._0_4_;
  auVar10._4_4_ = auVar9._4_4_ ^ auVar30._4_4_;
  auVar10._8_4_ = auVar9._8_4_ ^ auVar30._8_4_;
  auVar10._12_4_ = auVar9._12_4_ ^ auVar30._12_4_;
  auVar9 = vshufps_avx(auVar27,auVar27,0xff);
  auVar34 = vxorps_avx512dq(ZEXT1664(auVar24),auVar30);
  auVar8 = vxorps_avx512vl(auVar32._0_16_,auVar30._0_16_);
  auVar27 = vxorps_avx512vl(auVar31._0_16_,auVar30._0_16_);
  auVar24 = vshufps_avx(auVar7,auVar34._0_16_,0x8e);
  auVar35 = vpermi2ps_avx512f(_DAT_004fc380,auVar33,ZEXT1664(auVar15));
  auVar29 = vpermi2ps_avx512vl(_DAT_004fc1e0,ZEXT1632(auVar24),ZEXT1632(auVar44));
  auVar36 = vbroadcastss_avx512f(ZEXT416((uint)fVar1));
  auVar37 = vbroadcastss_avx512f(auVar8);
  auVar33 = vpermps_avx512f(ZEXT1664(_DAT_004fc110),auVar33);
  auVar38 = vbroadcastss_avx512f(ZEXT416((uint)FVar2));
  auVar31 = vpermi2ps_avx512f(_DAT_004fc3c0,
                              ZEXT4464(CONCAT440(auVar38._40_4_,
                                                 CONCAT436(auVar37._36_4_,
                                                           CONCAT432(auVar36._32_4_,
                                                                     CONCAT428(auVar31._28_4_,
                                                                               CONCAT424(auVar29.
                                                  _24_4_,CONCAT420(auVar32._20_4_,auVar29._0_20_))))
                                                  ))),ZEXT1664(auVar27));
  auVar32 = vmulps_avx512f(auVar35,auVar31);
  auVar31 = vfmsub213ps_avx512f(auVar31,auVar35,auVar32);
  auVar29 = vpermi2ps_avx512vl(_DAT_004fc200,ZEXT1632(auVar15),auVar33._0_32_);
  uVar46 = auVar12._0_4_;
  auVar43._4_4_ = uVar46;
  auVar43._0_4_ = uVar46;
  auVar43._8_4_ = uVar46;
  auVar43._12_4_ = uVar46;
  auVar43._16_4_ = uVar46;
  auVar43._20_4_ = uVar46;
  auVar43._24_4_ = uVar46;
  auVar43._28_4_ = uVar46;
  auVar29 = vblendps_avx(auVar29,auVar43,0x80);
  auVar33 = vpermi2ps_avx512f(_DAT_004fc400,ZEXT3264(auVar29),ZEXT1664(auVar42));
  auVar29 = vpermps_avx2(ZEXT1632(_DAT_004fc130),auVar28);
  auVar12 = vshufps_avx(auVar29._0_16_,auVar29._0_16_,0x93);
  auVar15._8_4_ = 0x80000000;
  auVar15._0_8_ = 0x8000000080000000;
  auVar15._12_4_ = 0x80000000;
  auVar12 = vxorps_avx512vl(auVar12,auVar15);
  auVar15 = vpermi2ps_avx512vl(ZEXT816(0x400000001),auVar11,auVar10);
  auVar35 = vpermps_avx512f(_DAT_004fc440,auVar33);
  auVar29 = vpermpd_avx2(ZEXT1632(auVar12),0x10);
  auVar29 = vblendps_avx(auVar29,ZEXT1632(auVar15),7);
  auVar30 = vpermi2ps_avx512f(_DAT_004fc480,
                              ZEXT3264(CONCAT428(auVar9._0_4_ ^ auVar30._0_4_,auVar29._0_28_)),
                              ZEXT1664(auVar11));
  lVar6 = 0;
  auVar30 = vpermi2ps_avx512f(_DAT_004fc4c0,auVar30,auVar34);
  auVar36 = vpermps_avx512f(_DAT_004fc780,auVar33);
  auVar30 = vpermi2ps_avx512f(_DAT_004fc500,auVar30,auVar39);
  auVar37 = vpermi2ps_avx512f(_DAT_004fc540,auVar30,auVar40);
  auVar38 = vpermps_avx512f(_DAT_004fc580,auVar33);
  auVar35 = vmulps_avx512f(auVar35,auVar37);
  auVar37 = vpermi2ps_avx512f(_DAT_004fc5c0,auVar40,auVar39);
  auVar37 = vpermi2pd_avx512f(_DAT_004fc600,auVar37,ZEXT1664(auVar11));
  auVar37 = vpermi2ps_avx512f(_DAT_004fc640,auVar37,auVar34);
  auVar39 = vpermi2ps_avx512f(_DAT_004fc6c0,auVar40,auVar39);
  auVar40 = vmulps_avx512f(auVar38,auVar37);
  auVar37 = vpermilps_avx512f(auVar40,_DAT_004fc680);
  auVar30 = vpermi2ps_avx512f(_DAT_004fc740,auVar30,ZEXT1664(auVar24));
  auVar38 = vblendmpd_avx512f(auVar35,auVar40);
  auVar38._0_56_ = auVar40._0_56_;
  auVar40 = vpermps_avx512f(_DAT_004fc700,auVar33);
  auVar30 = vfmsub213ps_avx512f(auVar36,auVar30,auVar38);
  auVar33 = vaddps_avx512f(auVar37,auVar35);
  auVar35 = vblendmpd_avx512f(auVar37,auVar35);
  auVar35._0_56_ = auVar34._0_56_;
  auVar39 = vfmsub213ps_avx512f(auVar40,auVar39,auVar35);
  auVar40 = vsubps_avx512f(auVar33,auVar38);
  auVar34 = vsubps_avx512f(auVar33,auVar40);
  auVar40 = vsubps_avx512f(auVar35,auVar40);
  auVar34 = vsubps_avx512f(auVar38,auVar34);
  auVar35 = vaddps_avx512f(auVar32,auVar33);
  auVar40 = vaddps_avx512f(auVar40,auVar34);
  auVar34 = vsubps_avx512f(auVar35,auVar33);
  auVar40 = vaddps_avx512f(auVar30,auVar40);
  auVar30 = vsubps_avx512f(auVar35,auVar34);
  auVar32 = vsubps_avx512f(auVar32,auVar34);
  auVar30 = vsubps_avx512f(auVar33,auVar30);
  auVar39 = vaddps_avx512f(auVar39,auVar40);
  auVar40 = vaddps_avx512f(auVar32,auVar30);
  auVar39 = vaddps_avx512f(auVar40,auVar39);
  auVar40 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar45)));
  auVar39 = vaddps_avx512f(auVar31,auVar39);
  auVar39 = vaddps_avx512f(auVar35,auVar39);
  local_88 = vmulps_avx512f(auVar39,auVar40);
  local_40[7] = in_RDI;
  do {
    uVar5 = *(undefined8 *)(local_88 + lVar6 + 8);
    *(undefined8 *)((long)local_40 + lVar6) = *(undefined8 *)(local_88 + lVar6);
    *(undefined8 *)((long)local_40 + lVar6 + 8) = uVar5;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  in_RDI->set = true;
  *(optional<pbrt::SquareMatrix<4>_> **)&in_RDI->optionalValue = local_40[0];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 8) = local_40[1];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 0x10) = local_40[2];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 0x18) = local_40[3];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 0x20) = local_40[4];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 0x28) = local_40[5];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 0x30) = local_40[6];
  *(optional<pbrt::SquareMatrix<4>_> **)((long)&in_RDI->optionalValue + 0x38) = local_40[7];
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU inline pstd::optional<SquareMatrix<4>> Inverse(const SquareMatrix<4> &m) {
    // Via: https://github.com/google/ion/blob/master/ion/math/matrixutils.cc,
    // (c) Google, Apache license.

    // For 4x4 do not compute the adjugate as the transpose of the cofactor
    // matrix, because this results in extra work. Several calculations can be
    // shared across the sub-determinants.
    //
    // This approach is explained in David Eberly's Geometric Tools book,
    // excerpted here:
    //   http://www.geometrictools.com/Documentation/LaplaceExpansionTheorem.pdf
    Float s0 = DifferenceOfProducts(m[0][0], m[1][1], m[1][0], m[0][1]);
    Float s1 = DifferenceOfProducts(m[0][0], m[1][2], m[1][0], m[0][2]);
    Float s2 = DifferenceOfProducts(m[0][0], m[1][3], m[1][0], m[0][3]);

    Float s3 = DifferenceOfProducts(m[0][1], m[1][2], m[1][1], m[0][2]);
    Float s4 = DifferenceOfProducts(m[0][1], m[1][3], m[1][1], m[0][3]);
    Float s5 = DifferenceOfProducts(m[0][2], m[1][3], m[1][2], m[0][3]);

    Float c0 = DifferenceOfProducts(m[2][0], m[3][1], m[3][0], m[2][1]);
    Float c1 = DifferenceOfProducts(m[2][0], m[3][2], m[3][0], m[2][2]);
    Float c2 = DifferenceOfProducts(m[2][0], m[3][3], m[3][0], m[2][3]);

    Float c3 = DifferenceOfProducts(m[2][1], m[3][2], m[3][1], m[2][2]);
    Float c4 = DifferenceOfProducts(m[2][1], m[3][3], m[3][1], m[2][3]);
    Float c5 = DifferenceOfProducts(m[2][2], m[3][3], m[3][2], m[2][3]);

    Float determinant = InnerProduct(s0, c5, -s1, c4, s2, c3, s3, c2, s5, c0, -s4, c1);
    if (determinant == 0)
        return {};
    Float s = 1 / determinant;

    Float inv[4][4] = {s * InnerProduct(m[1][1], c5, m[1][3], c3, -m[1][2], c4),
                       s * InnerProduct(-m[0][1], c5, m[0][2], c4, -m[0][3], c3),
                       s * InnerProduct(m[3][1], s5, m[3][3], s3, -m[3][2], s4),
                       s * InnerProduct(-m[2][1], s5, m[2][2], s4, -m[2][3], s3),

                       s * InnerProduct(-m[1][0], c5, m[1][2], c2, -m[1][3], c1),
                       s * InnerProduct(m[0][0], c5, m[0][3], c1, -m[0][2], c2),
                       s * InnerProduct(-m[3][0], s5, m[3][2], s2, -m[3][3], s1),
                       s * InnerProduct(m[2][0], s5, m[2][3], s1, -m[2][2], s2),

                       s * InnerProduct(m[1][0], c4, m[1][3], c0, -m[1][1], c2),
                       s * InnerProduct(-m[0][0], c4, m[0][1], c2, -m[0][3], c0),
                       s * InnerProduct(m[3][0], s4, m[3][3], s0, -m[3][1], s2),
                       s * InnerProduct(-m[2][0], s4, m[2][1], s2, -m[2][3], s0),

                       s * InnerProduct(-m[1][0], c3, m[1][1], c1, -m[1][2], c0),
                       s * InnerProduct(m[0][0], c3, m[0][2], c0, -m[0][1], c1),
                       s * InnerProduct(-m[3][0], s3, m[3][1], s1, -m[3][2], s0),
                       s * InnerProduct(m[2][0], s3, m[2][2], s0, -m[2][1], s1)};

    return SquareMatrix<4>(inv);
}